

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O0

void __thiscall cmCTestHG::StatusParser::~StatusParser(StatusParser *this)

{
  StatusParser *this_local;
  
  ~StatusParser(this);
  operator_delete(this,0x118);
  return;
}

Assistant:

StatusParser(cmCTestHG* hg, const char* prefix): HG(hg)
    {
    this->SetLog(&hg->Log, prefix);
    this->RegexStatus.compile("([MARC!?I]) (.*)");
    }